

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.cpp
# Opt level: O0

int __thiscall ncnn::Permute::forward(Permute *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  float *ptr_4;
  int j_4;
  int i_4;
  float *outptr_4;
  int q_4;
  int j_3;
  float *ptr_3;
  int i_3;
  float *outptr_3;
  int q_3;
  float *ptr_2;
  int j_2;
  int i_2;
  float *outptr_2;
  int q_2;
  int j_1;
  float *ptr_1;
  int i_1;
  float *outptr_1;
  int q_1;
  int j;
  int i;
  float *outptr;
  float *ptr;
  int q;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffc40;
  Mat *in_stack_fffffffffffffc48;
  Mat *pMVar3;
  undefined8 in_stack_fffffffffffffc50;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffffc58;
  int _w;
  Mat *in_stack_fffffffffffffc60;
  Mat local_320;
  Mat *local_2e8;
  int local_2e0;
  int local_2dc;
  Mat local_2d8;
  float *local_2a0;
  int local_298;
  int local_294;
  Mat local_290;
  float *local_258;
  int local_24c;
  Mat local_248;
  float *local_210;
  int local_204;
  Mat local_200;
  float *local_1c8;
  int local_1c0;
  int local_1bc;
  Mat local_1b8;
  float *local_180;
  int local_178;
  int local_174;
  Mat local_170;
  float *local_138;
  int local_12c;
  Mat local_128;
  float *local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  Mat local_d8;
  float *local_a0;
  Mat local_88;
  float *local_50;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RSI + 0x28);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  if (*(int *)(in_RDI + 0x80) == 0) {
    Mat::operator=(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  }
  else {
    _h = (int)in_stack_fffffffffffffc58;
    _w = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    _c = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
    if (*(int *)(in_RDI + 0x80) == 1) {
      Mat::create(in_stack_fffffffffffffc60,_w,_h,_c,(size_t)in_stack_fffffffffffffc48,
                  (Allocator *)in_stack_fffffffffffffc40);
      bVar1 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar1) {
        return -100;
      }
      for (local_44 = 0; local_44 < local_34; local_44 = local_44 + 1) {
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_88);
        Mat::~Mat((Mat *)0x14b599);
        local_50 = pfVar2;
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_d8);
        Mat::~Mat((Mat *)0x14b5f1);
        for (local_dc = 0; local_dc < local_2c; local_dc = local_dc + 1) {
          for (local_e0 = 0; local_e0 < local_30; local_e0 = local_e0 + 1) {
            pfVar2[local_dc * local_30 + local_e0] = local_50[local_e0 * local_2c + local_dc];
          }
        }
        local_a0 = pfVar2;
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 2) {
      Mat::create(in_stack_fffffffffffffc60,_w,_h,_c,(size_t)in_stack_fffffffffffffc48,
                  (Allocator *)in_stack_fffffffffffffc40);
      bVar1 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar1) {
        return -100;
      }
      for (local_e4 = 0; local_e4 < local_30; local_e4 = local_e4 + 1) {
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_128);
        Mat::~Mat((Mat *)0x14b7eb);
        local_f0 = pfVar2;
        for (local_12c = 0; local_12c < local_34; local_12c = local_12c + 1) {
          Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
          pfVar2 = Mat::row(&local_170,local_e4);
          Mat::~Mat((Mat *)0x14b85d);
          for (local_174 = 0; local_174 < local_2c; local_174 = local_174 + 1) {
            local_f0[local_12c * local_2c + local_174] = pfVar2[local_174];
          }
          local_138 = pfVar2;
        }
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 3) {
      Mat::create(in_stack_fffffffffffffc60,_w,_h,_c,(size_t)in_stack_fffffffffffffc48,
                  (Allocator *)in_stack_fffffffffffffc40);
      bVar1 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar1) {
        return -100;
      }
      for (local_178 = 0; local_178 < local_30; local_178 = local_178 + 1) {
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_1b8);
        Mat::~Mat((Mat *)0x14ba24);
        local_180 = pfVar2;
        for (local_1bc = 0; local_1bc < local_2c; local_1bc = local_1bc + 1) {
          for (local_1c0 = 0; local_1c0 < local_34; local_1c0 = local_1c0 + 1) {
            Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
            pfVar2 = Mat::row(&local_200,local_178);
            Mat::~Mat((Mat *)0x14bab5);
            local_180[local_1bc * local_34 + local_1c0] = pfVar2[local_1bc];
            local_1c8 = pfVar2;
          }
        }
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 4) {
      Mat::create(in_stack_fffffffffffffc60,_w,_h,_c,(size_t)in_stack_fffffffffffffc48,
                  (Allocator *)in_stack_fffffffffffffc40);
      bVar1 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar1) {
        return -100;
      }
      for (local_204 = 0; local_204 < local_2c; local_204 = local_204 + 1) {
        Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_248);
        Mat::~Mat((Mat *)0x14bc60);
        local_210 = pfVar2;
        for (local_24c = 0; local_24c < local_34; local_24c = local_24c + 1) {
          pMVar3 = &local_290;
          Mat::channel(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(pMVar3);
          Mat::~Mat((Mat *)0x14bccb);
          for (local_294 = 0; local_294 < local_30; local_294 = local_294 + 1) {
            local_210[local_24c * local_34 + local_294] = pfVar2[local_294 * local_2c + local_204];
          }
          local_258 = pfVar2;
        }
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 5) {
      Mat::create(in_stack_fffffffffffffc60,_w,_h,_c,(size_t)in_stack_fffffffffffffc48,
                  (Allocator *)in_stack_fffffffffffffc40);
      bVar1 = Mat::empty(in_stack_fffffffffffffc40);
      if (bVar1) {
        return -100;
      }
      for (local_298 = 0; local_298 < local_2c; local_298 = local_298 + 1) {
        pMVar3 = &local_2d8;
        Mat::channel(pMVar3,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(pMVar3);
        Mat::~Mat((Mat *)0x14bea3);
        local_2a0 = pfVar2;
        for (local_2dc = 0; local_2dc < local_30; local_2dc = local_2dc + 1) {
          for (local_2e0 = 0; local_2e0 < local_34; local_2e0 = local_2e0 + 1) {
            Mat::channel(pMVar3,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
            in_stack_fffffffffffffc40 = (Mat *)Mat::operator_cast_to_float_(&local_320);
            Mat::~Mat((Mat *)0x14bf2b);
            local_2a0[local_2dc * local_34 + local_2e0] =
                 *(float *)((long)&in_stack_fffffffffffffc40->data +
                           (long)(local_2dc * local_2c + local_298) * 4);
            local_2e8 = in_stack_fffffffffffffc40;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Permute::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    // order_type
    // 0 = w h c
    // 1 = h w c
    // 2 = w c h
    // 3 = c w h
    // 4 = h c w
    // 5 = c h w

    if (order_type == 0)
    {
        top_blob = bottom_blob;
    }
    else if (order_type == 1)
    {
        top_blob.create(h, w, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }
    }
    else if (order_type == 2)
    {
        top_blob.create(w, channels, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i).row(q);

                for (int j = 0; j < w; j++)
                {
                    outptr[i*w + j] = ptr[j];
                }
            }
        }
    }
    else if (order_type == 3)
    {
        top_blob.create(channels, w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j).row(q);

                    outptr[i*channels + j] = ptr[i];
                }
            }
        }
    }
    else if (order_type == 4)
    {
        top_blob.create(h, channels, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i);

                for (int j = 0; j < h; j++)
                {
                    outptr[i*channels + j] = ptr[j*w + q];
                }
            }
        }
    }
    else if (order_type == 5)
    {
        top_blob.create(channels, h, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j);

                    outptr[i*channels + j] = ptr[i*w + q];
                }
            }
        }
    }

    return 0;
}